

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O0

GCRef * gc_sweep(global_State *g,GCRef *p,uint32_t lim)

{
  uint uVar1;
  int iVar2;
  GCobj *pGVar3;
  int in_EDX;
  GCobj *in_RSI;
  global_State *in_RDI;
  GCobj *o;
  int ow;
  
  uVar1 = (in_RDI->gc).currentwhite ^ 3;
  while( true ) {
    pGVar3 = (GCobj *)(ulong)(in_RSI->gch).nextgc.gcptr32;
    iVar2 = in_EDX;
    if (pGVar3 != (GCobj *)0x0) {
      iVar2 = in_EDX + -1;
    }
    if (pGVar3 == (GCobj *)0x0 || in_EDX == 0) break;
    in_EDX = iVar2;
    if ((pGVar3->gch).gct == '\x06') {
      gc_sweep((global_State *)&in_RSI->gch,(GCRef *)CONCAT44(iVar2,uVar1),0);
      in_EDX = iVar2;
    }
    if ((((pGVar3->gch).marked ^ 3) & uVar1) == 0) {
      (in_RSI->gch).nextgc.gcptr32 = (pGVar3->gch).nextgc.gcptr32;
      if (pGVar3 == (GCobj *)(ulong)(in_RDI->gc).root.gcptr32) {
        (in_RDI->gc).root.gcptr32 = (pGVar3->gch).nextgc.gcptr32;
      }
      (*gc_freefunc[(pGVar3->gch).gct - 4])(in_RDI,pGVar3);
    }
    else {
      (pGVar3->gch).marked = (pGVar3->gch).marked & 0xf8 | (in_RDI->gc).currentwhite & 3;
      in_RSI = pGVar3;
    }
  }
  return (GCRef *)in_RSI;
}

Assistant:

static GCRef *gc_sweep(global_State *g, GCRef *p, uint32_t lim)
{
  /* Mask with other white and LJ_GC_FIXED. Or LJ_GC_SFIXED on shutdown. */
  int ow = otherwhite(g);
  GCobj *o;
  while ((o = gcref(*p)) != NULL && lim-- > 0) {
    if (o->gch.gct == ~LJ_TTHREAD)  /* Need to sweep open upvalues, too. */
      gc_fullsweep(g, &gco2th(o)->openupval);
    if (((o->gch.marked ^ LJ_GC_WHITES) & ow)) {  /* Black or current white? */
      lua_assert(!isdead(g, o) || (o->gch.marked & LJ_GC_FIXED));
      makewhite(g, o);  /* Value is alive, change to the current white. */
      p = &o->gch.nextgc;
    } else {  /* Otherwise value is dead, free it. */
      lua_assert(isdead(g, o) || ow == LJ_GC_SFIXED);
      setgcrefr(*p, o->gch.nextgc);
      if (o == gcref(g->gc.root))
	setgcrefr(g->gc.root, o->gch.nextgc);  /* Adjust list anchor. */
      gc_freefunc[o->gch.gct - ~LJ_TSTR](g, o);
    }
  }
  return p;
}